

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.hpp
# Opt level: O2

String __thiscall doctest::detail::fpToString<float>(detail *this,float value,int precision)

{
  long lVar1;
  string d;
  string local_1b0 [32];
  ostringstream oss;
  long local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(long *)((long)local_188 + *(long *)(_oss + -0x18)) = (long)precision;
  *(uint *)((long)auStack_178 + *(long *)(_oss + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(_oss + -0x18)) & 0xfffffefb | 4;
  std::ostream::operator<<((ostream *)&oss,value);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&d,0x30);
  if ((lVar1 != -1) && (lVar1 != d._M_string_length - 1)) {
    std::__cxx11::string::substr((ulong)local_1b0,(ulong)&d);
    std::__cxx11::string::operator=((string *)&d,local_1b0);
    std::__cxx11::string::~string(local_1b0);
  }
  String::String((String *)this,d._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  return (String)(char *)this;
}

Assistant:

String fpToString(T value, int precision) {
        std::ostringstream oss;
        oss << std::setprecision(precision) << std::fixed << value;
        std::string d = oss.str();
        size_t      i = d.find_last_not_of('0');
        if(i != std::string::npos && i != d.size() - 1) {
            if(d[i] == '.')
                i++;
            d = d.substr(0, i + 1);
        }
        return d.c_str();
    }